

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.cc
# Opt level: O1

bool __thiscall
testing::internal::ExpectationBase::AllPrerequisitesAreSatisfied(ExpectationBase *this)

{
  ExpectationBase *pEVar1;
  element_type *peVar2;
  int iVar3;
  _Rb_tree_node_base *p_Var4;
  ExpectationBase *__tmp;
  bool bVar5;
  vector<const_testing::internal::ExpectationBase_*,_std::allocator<const_testing::internal::ExpectationBase_*>_>
  expectations;
  ExpectationBase *next;
  ExpectationBase **local_48;
  iterator iStack_40;
  ExpectationBase **local_38;
  ExpectationBase *local_30;
  
  local_48 = (ExpectationBase **)0x0;
  iStack_40._M_current = (ExpectationBase **)0x0;
  local_38 = (ExpectationBase **)0x0;
  local_48 = (ExpectationBase **)operator_new(8);
  iStack_40._M_current = local_48 + 1;
  *local_48 = this;
  bVar5 = local_48 == iStack_40._M_current;
  local_38 = iStack_40._M_current;
  if (!bVar5) {
    do {
      pEVar1 = iStack_40._M_current[-1];
      iStack_40._M_current = iStack_40._M_current + -1;
      for (p_Var4 = (pEVar1->immediate_prerequisites_).expectations_._M_t._M_impl.
                    super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var4 !=
          &(pEVar1->immediate_prerequisites_).expectations_._M_t._M_impl.super__Rb_tree_header;
          p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
        local_30 = *(ExpectationBase **)(p_Var4 + 1);
        peVar2 = (local_30->cardinality_).impl_.
                 super___shared_ptr<const_testing::CardinalityInterface,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        iVar3 = (*peVar2->_vptr_CardinalityInterface[4])(peVar2,(ulong)(uint)local_30->call_count_);
        if ((char)iVar3 == '\0') goto LAB_0018cabe;
        if (iStack_40._M_current == local_38) {
          std::
          vector<testing::internal::ExpectationBase_const*,std::allocator<testing::internal::ExpectationBase_const*>>
          ::_M_realloc_insert<testing::internal::ExpectationBase_const*const&>
                    ((vector<testing::internal::ExpectationBase_const*,std::allocator<testing::internal::ExpectationBase_const*>>
                      *)&local_48,iStack_40,&local_30);
        }
        else {
          *iStack_40._M_current = local_30;
          iStack_40._M_current = iStack_40._M_current + 1;
        }
      }
      bVar5 = local_48 == iStack_40._M_current;
    } while (!bVar5);
  }
LAB_0018cabe:
  if (local_48 != (ExpectationBase **)0x0) {
    operator_delete(local_48,(long)local_38 - (long)local_48);
  }
  return bVar5;
}

Assistant:

GTEST_EXCLUSIVE_LOCK_REQUIRED_(g_gmock_mutex) {
  g_gmock_mutex.AssertHeld();
  ::std::vector<const ExpectationBase*> expectations(1, this);
  while (!expectations.empty()) {
    const ExpectationBase* exp = expectations.back();
    expectations.pop_back();

    for (ExpectationSet::const_iterator it =
             exp->immediate_prerequisites_.begin();
         it != exp->immediate_prerequisites_.end(); ++it) {
      const ExpectationBase* next = it->expectation_base().get();
      if (!next->IsSatisfied()) return false;
      expectations.push_back(next);
    }
  }
  return true;
}